

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

char * __thiscall asmjit::v1_14::String::prepare(String *this,ModifyOp op,size_t size)

{
  ulong uVar1;
  String SVar2;
  String *__ptr;
  ulong uVar3;
  ulong uVar4;
  void *__dest;
  String *__src;
  size_t sVar5;
  ulong __size;
  size_t __n;
  
  SVar2 = *this;
  __n = (size_t)(byte)SVar2;
  __ptr = *(String **)(this + 0x18);
  if (__n < 0x1f) {
    __src = this + 1;
    uVar3 = 0x1e;
  }
  else {
    uVar3 = *(ulong *)(this + 0x10);
    __n = *(size_t *)(this + 8);
    __src = __ptr;
  }
  if (op == kAssign) {
    if (uVar3 < size) {
      if (0xfffffffffefffffe < size) {
        return (char *)0x0;
      }
      __src = (String *)malloc((size & 0xffffffffffffff80) + 0x80);
      if (__src == (String *)0x0) {
        return (char *)0x0;
      }
      if (SVar2 == (String)0x1f) {
        free(__ptr);
      }
      *this = (String)0x1f;
      *(size_t *)(this + 8) = size;
      *(size_t *)(this + 0x10) = size | 0x7f;
      *(String **)(this + 0x18) = __src;
    }
    else if ((byte)SVar2 < 0x1f) {
      *this = SUB81(size,0);
    }
    else {
      *(size_t *)(this + 8) = size;
    }
    __src[size] = (String)0x0;
    return (char *)__src;
  }
  if (-__n - 0x1000002 <= size) {
    return (char *)0x0;
  }
  uVar1 = __n + size;
  if (uVar1 <= uVar3) {
    if ((byte)SVar2 < 0x1f) {
      *this = SUB81(uVar1,0);
    }
    else {
      *(ulong *)(this + 8) = uVar1;
    }
    __src[uVar1] = (String)0x0;
    return (char *)(__src + __n);
  }
  uVar3 = uVar1 + 1;
  if (0xfffffffffefffffe < uVar3) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/string.cpp"
               ,0x1b,"minimumByteSize < kMaxAllocSize");
  }
  sVar5 = 0x1ff;
  if (0x1ff < size) {
    sVar5 = size;
  }
  uVar4 = 0x80;
  if (0x7e < size) {
    uVar4 = sVar5 + 1;
  }
  if (uVar4 < uVar3) {
    uVar4 = uVar1 >> 1 | uVar1;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar4 = uVar4 >> 0x10 | uVar4;
    uVar4 = (uVar4 >> 0x20 | uVar4) + 1;
    __size = uVar3;
    if (uVar4 < uVar3) goto LAB_00125984;
    if (0x1000000 < uVar4) {
      uVar4 = ((uint)uVar3 & 0xffffff) + uVar3;
    }
  }
  __size = 0xfffffffffeffffff;
  if (uVar4 < 0xfffffffffeffffff) {
    __size = uVar4;
  }
  if (__size < uVar3) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/string.cpp"
               ,0x8f,"newCapacityPlusOne >= newSizePlusOne");
  }
LAB_00125984:
  __dest = malloc(__size);
  if (__dest == (void *)0x0) {
    return (char *)0x0;
  }
  memcpy(__dest,__src,__n);
  if (SVar2 == (String)0x1f) {
    free(__ptr);
  }
  *this = (String)0x1f;
  *(ulong *)(this + 8) = uVar1;
  *(ulong *)(this + 0x10) = __size - 1;
  *(void **)(this + 0x18) = __dest;
  *(undefined1 *)((long)__dest + uVar1) = 0;
  return (char *)((long)__dest + __n);
}

Assistant:

char* String::prepare(ModifyOp op, size_t size) noexcept {
  char* curData;
  size_t curSize;
  size_t curCapacity;

  if (isLargeOrExternal()) {
    curData = _large.data;
    curSize = _large.size;
    curCapacity = _large.capacity;
  }
  else {
    curData = _small.data;
    curSize = _small.type;
    curCapacity = kSSOCapacity;
  }

  if (op == ModifyOp::kAssign) {
    if (size > curCapacity) {
      // Prevent arithmetic overflow.
      if (ASMJIT_UNLIKELY(size >= kMaxAllocSize))
        return nullptr;

      size_t newCapacity = Support::alignUp<size_t>(size + 1, kMinAllocSize);
      char* newData = static_cast<char*>(::malloc(newCapacity));

      if (ASMJIT_UNLIKELY(!newData))
        return nullptr;

      if (_type == kTypeLarge)
        ::free(curData);

      _large.type = kTypeLarge;
      _large.size = size;
      _large.capacity = newCapacity - 1;
      _large.data = newData;

      newData[size] = '\0';
      return newData;
    }
    else {
      _setSize(size);
      curData[size] = '\0';
      return curData;
    }
  }
  else {
    // Prevent arithmetic overflow.
    if (ASMJIT_UNLIKELY(size >= kMaxAllocSize - curSize - 1))
      return nullptr;

    size_t newSize = size + curSize;
    size_t newSizePlusOne = newSize + 1;

    if (newSize > curCapacity) {
      size_t newCapacityPlusOne = String_growCapacity(size + 1u, newSizePlusOne);
      ASMJIT_ASSERT(newCapacityPlusOne >= newSizePlusOne);

      if (ASMJIT_UNLIKELY(newCapacityPlusOne < newSizePlusOne))
        return nullptr;

      char* newData = static_cast<char*>(::malloc(newCapacityPlusOne));
      if (ASMJIT_UNLIKELY(!newData))
        return nullptr;

      memcpy(newData, curData, curSize);

      if (_type == kTypeLarge)
        ::free(curData);

      _large.type = kTypeLarge;
      _large.size = newSize;
      _large.capacity = newCapacityPlusOne - 1;
      _large.data = newData;

      newData[newSize] = '\0';
      return newData + curSize;
    }
    else {
      _setSize(newSize);
      curData[newSize] = '\0';
      return curData + curSize;
    }
  }
}